

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O0

type __thiscall
jsoncons::jsonpointer::basic_json_pointer<char>::operator/=
          (basic_json_pointer<char> *this,unsigned_long val)

{
  type in_RDI;
  string_type s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000118;
  unsigned_long in_stack_00000120;
  value_type *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc0;
  value_type local_30;
  
  __x = &local_30;
  std::__cxx11::string::string((string *)__x);
  jsoncons::detail::from_integer<unsigned_long,std::__cxx11::string>
            (in_stack_00000120,in_stack_00000118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_ffffffffffffffc0,__x);
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

typename std::enable_if<ext_traits::is_integer<IntegerType>::value, basic_json_pointer&>::type
        operator/=(IntegerType val)
        {
            string_type s;
            jsoncons::detail::from_integer(val, s);
            tokens_.push_back(s);

            return *this;
        }